

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

wostream * Centaurus::operator<<(wostream *os,PriorityChainElement *e)

{
  int iVar1;
  Identifier *id;
  wostream *pwVar2;
  int __c;
  char *pcVar3;
  PriorityChainElement *e_local;
  wostream *os_local;
  
  id = PriorityChainElement::id(e);
  pwVar2 = operator<<(os,id);
  pcVar3 = (char *)0x3a;
  pwVar2 = std::operator<<(pwVar2,L':');
  pcVar3 = PriorityChainElement::index(e,pcVar3,__c);
  pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,(int)pcVar3);
  pwVar2 = std::operator<<(pwVar2,L'=');
  iVar1 = PriorityChainElement::priority(e);
  std::wostream::operator<<(pwVar2,iVar1);
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const PriorityChainElement& e)
{
    os << e.id() << L':' << e.index() << L'=' << e.priority();
    return os;
}